

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkCollectHie(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  void *pvVar1;
  int i;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                  ,0x1f9,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == 0) {
    p_00 = Vec_PtrAlloc(1000);
    if (pNtk->pDesign == (Abc_Des_t *)0x0) {
      Vec_PtrPush(p_00,pNtk);
    }
    else {
      p = pNtk->pDesign->vModules;
      for (i = 0; i < p->nSize; i = i + 1) {
        pvVar1 = Vec_PtrEntry(p,i);
        *(undefined4 *)((long)pvVar1 + 0xa8) = 0xffffffff;
      }
      Abc_NtkCollectHie_rec(pNtk,p_00);
    }
    return p_00;
  }
  __assert_fail("!Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                ,0x1fa,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vResult;
    Abc_Ntk_t * pModel;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    vResult = Vec_PtrAlloc( 1000 );
    if ( pNtk->pDesign == NULL )
    {
        Vec_PtrPush( vResult, pNtk );
        return vResult;
    }

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
        pModel->iStep = -1;

    Abc_NtkCollectHie_rec( pNtk, vResult );
    return vResult;    
}